

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Element
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,RegSlot Element,
          bool instanceAtReturnRegOK,bool forceStrictMode)

{
  Type TVar1;
  FunctionBody *pFVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  RegSlot Value_00;
  RegSlot Instance_00;
  RegSlot Element_00;
  undefined4 *puVar6;
  undefined3 in_register_00000089;
  OpCode op_00;
  Type local_36;
  undefined4 local_34;
  ProfileId profileId;
  
  local_34 = CONCAT31(in_register_00000089,instanceAtReturnRegOK);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x2f);
  bVar4 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x556,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_007cd22f;
    *puVar6 = 0;
  }
  Value_00 = ConsumeReg(this,Value);
  Instance_00 = ConsumeReg(this,Instance);
  Element_00 = ConsumeReg(this,Element);
  op_00 = op;
  if (forceStrictMode) {
    op_00 = DeleteElemIStrict_A;
  }
  if ((*(ushort *)
        &(this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x100
      ) != 0) {
    op_00 = DeleteElemIStrict_A;
  }
  if (op != DeleteElemI_A) {
    op_00 = op;
  }
  local_36 = 0xffff;
  if (Instance_00 == 0 && (char)local_34 == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x566,"(instanceAtReturnRegOK || Instance != 0)",
                                "instanceAtReturnRegOK || Instance != 0");
    if (!bVar4) goto LAB_007cd22f;
    *puVar6 = 0;
  }
  bVar4 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
  if ((((bVar4) || (bVar4 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar4)) ||
      (bVar4 = DoDynamicProfileOpcode(this,TypedArrayTypeSpecPhase,false), bVar4)) ||
     (bVar4 = DoDynamicProfileOpcode(this,ArrayCheckHoistPhase,false), bVar4)) {
    if (op_00 == StElemI_A_Strict) {
      op_00 = ProfiledStElemI_A_Strict;
    }
    else {
      if (op_00 != StElemI_A) {
        if (op_00 == LdElemI_A) {
          pFVar2 = this->m_functionWrite;
          TVar1 = pFVar2->profiledLdElemCount;
          if (TVar1 == 0xffff) {
            bVar4 = true;
            local_34 = 0;
            op_00 = LdElemI_A;
          }
          else {
            pFVar2->profiledLdElemCount = TVar1 + 1;
            local_34 = (undefined4)CONCAT71((int7)((ulong)pFVar2 >> 8),1);
            bVar4 = false;
            op_00 = ProfiledLdElemI_A;
            local_36 = TVar1;
          }
        }
        else {
          bVar4 = true;
          local_34 = 0;
        }
        goto LAB_007cd10d;
      }
      op_00 = ProfiledStElemI_A;
    }
    pFVar2 = this->m_functionWrite;
    TVar1 = pFVar2->profiledStElemCount;
    if (TVar1 == 0xffff) {
      bVar4 = true;
      local_34 = 0;
      op_00 = op;
    }
    else {
      pFVar2->profiledStElemCount = TVar1 + 1;
      local_34 = (undefined4)CONCAT71((int7)((ulong)pFVar2 >> 8),1);
      bVar4 = false;
      local_36 = TVar1;
    }
  }
  else {
    local_34 = 0;
    bVar4 = true;
  }
LAB_007cd10d:
  bVar5 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op_00,Value_00,Instance_00,Element_00);
  if (((!bVar5) &&
      (bVar5 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,op_00,Value_00,Instance_00,Element_00), !bVar5)) &&
     (bVar5 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op_00,Value_00,Instance_00,Element_00), !bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x588,"(success)","success");
    if (!bVar5) goto LAB_007cd22f;
    *puVar6 = 0;
  }
  if ((char)local_34 != '\0') {
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x58b,"(profileId != Js::Constants::NoProfileId)",
                                  "profileId != Js::Constants::NoProfileId");
      if (!bVar4) {
LAB_007cd22f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    Data::Write(&this->m_byteCodeData,&local_36,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Element(OpCode op, RegSlot Value, RegSlot Instance, RegSlot Element, bool instanceAtReturnRegOK, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementI);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);
        Element = ConsumeReg(Element);

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteElemI_A)
            {
                op = OpCode::DeleteElemIStrict_A;
            }
        }

        bool isProfiledLayout = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Assert(instanceAtReturnRegOK || Instance != 0);
        if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
            DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            OpCode newop;
            switch (op)
            {
            case OpCode::LdElemI_A:
                newop = OpCode::ProfiledLdElemI_A;
                if (this->m_functionWrite->AllocProfiledLdElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;

            case Js::OpCode::StElemI_A:
                newop = OpCode::ProfiledStElemI_A;
                goto StoreCommon;

            case Js::OpCode::StElemI_A_Strict:
                newop = OpCode::ProfiledStElemI_A_Strict;
StoreCommon:
                if (this->m_functionWrite->AllocProfiledStElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementI, op, Value, Instance, Element);
        if (isProfiledLayout)
        {
            Assert(profileId != Js::Constants::NoProfileId);
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }